

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteRange(Bac_Ntk_t *p,int Beg,int End)

{
  Vec_Str_t *p_00;
  Vec_Str_t *vStr;
  int End_local;
  int Beg_local;
  Bac_Ntk_t *p_local;
  
  p_00 = p->pDesign->vOut;
  Vec_StrPrintStr(p_00,"[");
  if (-1 < End) {
    Vec_StrPrintNum(p_00,End);
    Vec_StrPrintStr(p_00,":");
  }
  Vec_StrPrintNum(p_00,Beg);
  Vec_StrPrintStr(p_00,"]");
  return;
}

Assistant:

static inline void Bac_ManWriteRange( Bac_Ntk_t * p, int Beg, int End )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    Vec_StrPrintStr( vStr, "[" );
    if ( End >= 0 )
    {
        Vec_StrPrintNum( vStr, End );
        Vec_StrPrintStr( vStr, ":" );
    }
    Vec_StrPrintNum( vStr, Beg );
    Vec_StrPrintStr( vStr, "]" );
}